

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Int(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
      *this,int i)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  uint32_t u;
  char *pcVar2;
  
  Prefix(this,kNumberType);
  this_00 = &this->os_->stack_;
  pcVar2 = this_00->stackTop_;
  if ((long)this_00->stackEnd_ - (long)pcVar2 < 0xb) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0xb);
    pcVar2 = this_00->stackTop_;
  }
  this_00->stackTop_ = pcVar2 + 0xb;
  pcVar1 = pcVar2;
  if (i < 0) {
    *pcVar2 = '-';
    i = -i;
    pcVar1 = pcVar2 + 1;
  }
  pcVar1 = internal::u32toa(i,pcVar1);
  (this->os_->stack_).stackTop_ =
       pcVar1 + (long)((this->os_->stack_).stackTop_ + (-0xb - (long)pcVar2));
  return true;
}

Assistant:

bool Int(int i)             { Prefix(kNumberType); return EndValue(WriteInt(i)); }